

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

void __thiscall groundupdbext::FileKeyValueStore::Impl::Impl(Impl *this,string *fullpath)

{
  string *fullpath_local;
  Impl *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)fullpath);
  HighwayHash::HighwayHash(&this->m_hasher);
  return;
}

Assistant:

FileKeyValueStore::Impl::Impl(std::string fullpath)
  : m_fullpath(fullpath), m_hasher()
{
  ;
}